

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t right;
  sysbvm_tuple_t nodeTypeString;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_b5b2b19e gcFrame;
  sysbvm_tuple_t environment_local;
  sysbvm_tuple_t astNode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&nodeTypeString,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&nodeTypeString);
  sVar1 = sysbvm_tuple_getType(context,astNode);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_type_getAstNodeAnalysisFunction(context,sVar1);
  if (gcFrameRecord.roots == (sysbvm_tuple_t *)0x0) {
    sysbvm_error("Cannot analyze non AST node tuple.");
  }
  sVar1 = sysbvm_function_applyNoCheck2
                    (context,(sysbvm_tuple_t)gcFrameRecord.roots,astNode,environment);
  sVar2 = sysbvm_astNode_getAnalyzedType(sVar1);
  if (sVar2 == 0) {
    sVar2 = sysbvm_tuple_getType(context,sVar1);
    sVar2 = sysbvm_tuple_printString(context,sVar2);
    right = sysbvm_string_createWithCString(context," without analyzed type");
    sVar2 = sysbvm_string_concat(context,sVar2,right);
    sysbvm_errorWithMessageTuple(sVar2);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&nodeTypeString);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeAnalysisFunction(context, sysbvm_tuple_getType(context, astNode));
    if(!gcFrame.function)
        sysbvm_error("Cannot analyze non AST node tuple.");

    gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.function, astNode, environment);
    if(!sysbvm_astNode_getAnalyzedType(gcFrame.result))
    {
        sysbvm_tuple_t nodeTypeString = sysbvm_tuple_printString(context, sysbvm_tuple_getType(context, gcFrame.result));
        sysbvm_errorWithMessageTuple(sysbvm_string_concat(context,
            nodeTypeString,
            sysbvm_string_createWithCString(context, " without analyzed type"))
        );
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}